

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::LocalVarCheckVisitor::visit<slang::ast::MinTypMaxExpression>
          (LocalVarCheckVisitor *this,MinTypMaxExpression *expr)

{
  bool bVar1;
  MinTypMaxExpression *pMVar2;
  Expression *in_RSI;
  long in_RDI;
  undefined1 unaff_retaddr;
  Expression *in_stack_00000008;
  Visibility in_stack_0000001c;
  SubroutineSymbol *sub;
  CallExpression *call;
  Symbol *sym;
  LocalVarCheckVisitor *in_stack_ffffffffffffffb8;
  MinTypMaxExpression *in_stack_ffffffffffffffc0;
  
  if ((*(byte *)(in_RDI + 0x20) & 1) == 0) {
    bVar1 = ValueExpressionBase::isKind(in_RSI->kind);
    if (bVar1) {
      pMVar2 = (MinTypMaxExpression *)
               Expression::getSymbolReference(in_stack_00000008,(bool)unaff_retaddr);
      if ((pMVar2 != (MinTypMaxExpression *)0x0) &&
         ((pMVar2->super_Expression).kind == (Dist|ValueRange))) {
        Symbol::as<slang::ast::ClassPropertySymbol>((Symbol *)0x465bb9);
        checkVisibility((LocalVarCheckVisitor *)sym,(Symbol *)call,(Expression *)sub,
                        in_stack_0000001c);
        in_stack_ffffffffffffffc0 = pMVar2;
      }
    }
    else if (in_RSI->kind == Call) {
      Expression::as<slang::ast::CallExpression>(in_RSI);
      bVar1 = CallExpression::isSystemCall((CallExpression *)0x465bf8);
      if (!bVar1) {
        std::
        get<slang::ast::SubroutineSymbol_const*,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                  ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                    *)0x465c0a);
        checkVisibility((LocalVarCheckVisitor *)sym,(Symbol *)call,(Expression *)sub,
                        in_stack_0000001c);
      }
    }
    MinTypMaxExpression::visitExprs<slang::ast::LocalVarCheckVisitor&>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if (anyErrors)
            return;

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ValueExpressionBase::isKind(expr.kind)) {
                if (auto sym = expr.getSymbolReference();
                    sym && sym->kind == SymbolKind::ClassProperty) {
                    checkVisibility(*sym, expr, sym->template as<ClassPropertySymbol>().visibility);
                }
            }
            else if (expr.kind == ExpressionKind::Call) {
                auto& call = expr.template as<CallExpression>();
                if (!call.isSystemCall()) {
                    auto& sub = *std::get<const SubroutineSymbol*>(call.subroutine);
                    checkVisibility(sub, expr, sub.visibility);
                }
            }

            if constexpr (HasVisitExprs<T, LocalVarCheckVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }